

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall ldc::address(ldc *this,context *ctx,token *token,opcode *op)

{
  opcode *min;
  bool bVar1;
  int iVar2;
  uint64_t *result;
  token local_f8;
  byte local_c9;
  token local_c8;
  byte local_99;
  long local_98;
  uint64_t value;
  uint local_68;
  byte local_51;
  token local_50;
  opcode *local_28;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  local_28 = op;
  op_local = (opcode *)token;
  token_local = (token *)ctx;
  ctx_local = (context *)this;
  iVar2 = equal(token,"c");
  if (iVar2 == 0) {
    fail((token *)this,(char *)op_local,"expected constant buffer");
  }
  else {
    context::tokenize(&local_50,(context *)token_local);
    memcpy(op_local,&local_50,0x24);
    local_51 = 0;
    confirm_type((token *)this,(token_type)op_local);
    bVar1 = error::operator_cast_to_bool((error *)this);
    if (bVar1) {
      local_51 = 1;
    }
    local_68 = (uint)bVar1;
    if ((local_51 & 1) == 0) {
      error::~error((error *)this);
    }
    if (local_68 == 0) {
      context::tokenize((token *)&value,(context *)token_local);
      memcpy(op_local,&value,0x24);
      min = op_local;
      local_99 = 0;
      result = (uint64_t *)max_bits(5);
      convert_integer((token *)this,(int64_t)min,0,result);
      bVar1 = error::operator_cast_to_bool((error *)this);
      if (bVar1) {
        local_99 = 1;
      }
      local_68 = (uint)bVar1;
      if ((local_99 & 1) == 0) {
        error::~error((error *)this);
      }
      if (local_68 == 0) {
        opcode::add_bits(local_28,local_98 << 0x24);
        context::tokenize(&local_c8,(context *)token_local);
        memcpy(op_local,&local_c8,0x24);
        local_c9 = 0;
        confirm_type((token *)this,(token_type)op_local);
        bVar1 = error::operator_cast_to_bool((error *)this);
        if (bVar1) {
          local_c9 = 1;
        }
        local_68 = (uint)bVar1;
        if ((local_c9 & 1) == 0) {
          error::~error((error *)this);
        }
        if (local_68 == 0) {
          context::tokenize(&local_f8,(context *)token_local);
          memcpy(op_local,&local_f8,0x24);
          memory::address<true,20,16,0>
                    ((memory *)this,(context *)token_local,(token *)op_local,local_28);
        }
      }
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(address)
    {
        if (!equal(token, "c")) {
            return fail(token, "expected constant buffer");
        }
        token = ctx.tokenize();
        CHECK(confirm_type(token, token_type::bracket_left));

        token = ctx.tokenize();
        uint64_t value;
        CHECK(convert_integer(token, 0, max_bits(5), &value));
        op.add_bits(static_cast<uint64_t>(value) << 36);

        token = ctx.tokenize();
        CHECK(confirm_type(token, token_type::bracket_right));

        token = ctx.tokenize();
        return memory::address<true, 20, 16, 0>(ctx, token, op);
    }